

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadUnix.c
# Opt level: O0

deUint32 deGetNumTotalLogicalCores(void)

{
  long lVar1;
  long count;
  
  lVar1 = sysconf(0x53);
  if (lVar1 < 1) {
    count._4_4_ = 1;
  }
  else {
    count._4_4_ = (deUint32)lVar1;
  }
  return count._4_4_;
}

Assistant:

deUint32 deGetNumTotalLogicalCores (void)
{
#if defined(_SC_NPROCESSORS_CONF)
	const long count = sysconf(_SC_NPROCESSORS_CONF);

	if (count <= 0)
		return 1;
	else
		return (deUint32)count;
#else
	return 1;
#endif
}